

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

QRect __thiscall
QTableViewPrivate::intersectedRect
          (QTableViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  minMaxPair mVar1;
  minMaxPair bounds;
  Representation RVar2;
  Representation RVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  QRect QVar5;
  QRect local_68;
  QRect local_58;
  anon_class_8_1_54a39811 local_48;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.q = *(QTableView **)
                &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_40.y1 = rect.y1.m_i;
  local_40.y2 = rect.y2.m_i;
  mVar1.second = local_40.y2.m_i;
  mVar1.first = local_40.y1.m_i;
  local_40._0_8_ = rect._0_8_;
  local_40._8_8_ = rect._8_8_;
  mVar1 = intersectedRect::anon_class_8_1_54a39811::operator()
                    (&local_48,this->verticalHeader,topLeft->r,bottomRight->r,mVar1);
  RVar3.m_i = mVar1.first;
  RVar2.m_i = mVar1.second;
  if (RVar3.m_i == RVar2.m_i) {
    QVar5 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    local_58.y1.m_i = RVar3.m_i;
    local_58.x1.m_i = local_40.x1.m_i;
    local_58.y2.m_i = RVar2.m_i;
    local_58.x2.m_i = local_40.x2.m_i;
    auVar4 = QRect::operator&(&local_40,&local_58);
    if ((auVar4._0_4_ + -1 == auVar4._8_4_) && (auVar4._4_4_ + -1 == auVar4._12_4_)) {
      QVar5 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    }
    else {
      bounds.second = local_40.x2.m_i;
      bounds.first = local_40.x1.m_i;
      mVar1 = intersectedRect::anon_class_8_1_54a39811::operator()
                        (&local_48,this->horizontalHeader,topLeft->c,bottomRight->c,bounds);
      local_68.y1.m_i = RVar3.m_i;
      local_68.x1.m_i = mVar1.first;
      local_68.y2.m_i = RVar2.m_i;
      local_68.x2.m_i = mVar1.second;
      QVar5 = (QRect)QRect::operator&(&local_40,&local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    Q_Q(const QTableView);

    using minMaxPair = std::pair<int, int>;
    const auto calcMinMax = [q](QHeaderView *hdr, int startIdx, int endIdx, minMaxPair bounds) -> minMaxPair
    {
        minMaxPair ret(std::numeric_limits<int>::max(), std::numeric_limits<int>::min());
        if (hdr->sectionsMoved()) {
            for (int i = startIdx; i <= endIdx; ++i) {
                const int start = hdr->sectionViewportPosition(i);
                const int end = start + hdr->sectionSize(i);
                ret.first = std::min(start, ret.first);
                ret.second = std::max(end, ret.second);
                if (ret.first <= bounds.first && ret.second >= bounds.second)
                    break;
            }
        } else {
            if (q->isRightToLeft() && q->horizontalHeader() == hdr)
                std::swap(startIdx, endIdx);
            ret.first = hdr->sectionViewportPosition(startIdx);
            ret.second = hdr->sectionViewportPosition(endIdx) +
                         hdr->sectionSize(endIdx);
        }
        return ret;
    };

    const auto yVals = calcMinMax(verticalHeader, topLeft.row(), bottomRight.row(),
                                  minMaxPair(rect.top(), rect.bottom()));
    if (yVals.first == yVals.second) // all affected rows are hidden
        return QRect();

    // short circuit: check if no row is inside rect
    const QRect colRect(QPoint(rect.left(), yVals.first),
                        QPoint(rect.right(), yVals.second));
    const QRect intersected = rect.intersected(colRect);
    if (intersected.isNull())
        return QRect();

    const auto xVals = calcMinMax(horizontalHeader, topLeft.column(), bottomRight.column(),
                                  minMaxPair(rect.left(), rect.right()));
    const QRect updateRect(QPoint(xVals.first, yVals.first),
                           QPoint(xVals.second, yVals.second));
    return rect.intersected(updateRect);
}